

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::FramebufferGLImpl::FramebufferGLImpl
          (FramebufferGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
          FramebufferDesc *Desc,GLContextState *CtxState)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  uint *puVar5;
  TextureViewGLImpl *pTVar6;
  GLFBOCreateReleaseHelper local_150;
  GLFrameBufferObj local_14c;
  uint *local_138;
  AttachmentReference *RslvAttachmentRef;
  Uint32 rt_1;
  TextureViewGLImpl *ppRsvlViews [8];
  GLFBOCreateReleaseHelper local_e0;
  undefined1 local_dc [8];
  GLFrameBufferObj ResolveFBO;
  GLFrameBufferObj RenderTargetFBO;
  AttachmentReference *RTAttachmentRef;
  TextureViewGLImpl *pTStack_a0;
  Uint32 rt;
  TextureViewGLImpl *pDSV;
  TextureViewGLImpl *ppRTVs [8];
  SubpassDesc *SubpassDesc;
  Uint32 subpass;
  RenderPassDesc *RPDesc;
  GLContextState *CtxState_local;
  FramebufferDesc *Desc_local;
  RenderDeviceGLImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  FramebufferGLImpl *this_local;
  long lVar3;
  
  FramebufferBase<Diligent::EngineGLImplTraits>::FramebufferBase
            (&this->super_FramebufferBase<Diligent::EngineGLImplTraits>,pRefCounters,pDevice,Desc,
             false);
  (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  .super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_013a8230;
  std::
  vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ::vector(&this->m_SubpassFramebuffers);
  iVar2 = (*(((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              .m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  std::
  vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ::reserve(&this->m_SubpassFramebuffers,(ulong)*(uint *)(lVar3 + 0x18));
  for (SubpassDesc._0_4_ = 0; (uint)SubpassDesc < *(uint *)(lVar3 + 0x18);
      SubpassDesc._0_4_ = (uint)SubpassDesc + 1) {
    lVar4 = *(long *)(lVar3 + 0x20) + (ulong)(uint)SubpassDesc * 0x48;
    memset(&pDSV,0,0x40);
    pTStack_a0 = (TextureViewGLImpl *)0x0;
    for (RTAttachmentRef._4_4_ = 0; RTAttachmentRef._4_4_ < *(uint *)(lVar4 + 0x10);
        RTAttachmentRef._4_4_ = RTAttachmentRef._4_4_ + 1) {
      puVar5 = (uint *)(*(long *)(lVar4 + 0x18) + (ulong)RTAttachmentRef._4_4_ * 8);
      if (*puVar5 != 0xffffffff) {
        pTVar6 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                           ((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                            .m_Desc.ppAttachments[*puVar5]);
        ppRTVs[(ulong)RTAttachmentRef._4_4_ - 1] = pTVar6;
      }
    }
    if ((*(long *)(lVar4 + 0x28) != 0) && (**(int **)(lVar4 + 0x28) != -1)) {
      pTStack_a0 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                             ((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                              .m_Desc.ppAttachments[**(uint **)(lVar4 + 0x28)]);
    }
    bVar1 = UseDefaultFBO(*(Uint32 *)(lVar4 + 0x10),&pDSV,pTStack_a0);
    if (bVar1) {
      GLObjectWrappers::GLFBOCreateReleaseHelper::GLFBOCreateReleaseHelper
                ((GLFBOCreateReleaseHelper *)&ResolveFBO.m_NumDrawBuffers,0);
      GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj
                ((GLFrameBufferObj *)&ResolveFBO.m_DrawBuffersMask,false,
                 (GLFBOCreateReleaseHelper)ResolveFBO.m_NumDrawBuffers);
    }
    else {
      FBOCache::CreateFBO((GLFrameBufferObj *)&ResolveFBO.m_DrawBuffersMask,CtxState,
                          *(Uint32 *)(lVar4 + 0x10),&pDSV,pTStack_a0,Desc->Width,Desc->Height);
    }
    GLObjectWrappers::GLFBOCreateReleaseHelper::GLFBOCreateReleaseHelper(&local_e0,0);
    GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj
              ((GLFrameBufferObj *)local_dc,false,local_e0);
    if (*(long *)(lVar4 + 0x20) != 0) {
      memset(&stack0xfffffffffffffed8,0,0x40);
      for (RslvAttachmentRef._4_4_ = 0; RslvAttachmentRef._4_4_ < *(uint *)(lVar4 + 0x10);
          RslvAttachmentRef._4_4_ = RslvAttachmentRef._4_4_ + 1) {
        local_138 = (uint *)(*(long *)(lVar4 + 0x20) + (ulong)RslvAttachmentRef._4_4_ * 8);
        if (*local_138 != 0xffffffff) {
          pTVar6 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                             ((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                              .m_Desc.ppAttachments[*local_138]);
          *(TextureViewGLImpl **)(&stack0xfffffffffffffed8 + (ulong)RslvAttachmentRef._4_4_ * 8) =
               pTVar6;
        }
      }
      bVar1 = UseDefaultFBO(*(Uint32 *)(lVar4 + 0x10),(TextureViewGLImpl **)&stack0xfffffffffffffed8
                            ,(TextureViewGLImpl *)0x0);
      if (bVar1) {
        GLObjectWrappers::GLFBOCreateReleaseHelper::GLFBOCreateReleaseHelper(&local_150,0);
        GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj(&local_14c,false,local_150);
      }
      else {
        FBOCache::CreateFBO(&local_14c,CtxState,*(Uint32 *)(lVar4 + 0x10),
                            (TextureViewGLImpl **)&stack0xfffffffffffffed8,(TextureViewGLImpl *)0x0,
                            Desc->Width,Desc->Height);
      }
      GLObjectWrappers::GLFrameBufferObj::operator=((GLFrameBufferObj *)local_dc,&local_14c);
      GLObjectWrappers::GLFrameBufferObj::~GLFrameBufferObj(&local_14c);
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::SetName
              ((GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *)
               &ResolveFBO.m_DrawBuffersMask,
               (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    std::
    vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
    ::emplace_back<GLObjectWrappers::GLFrameBufferObj,GLObjectWrappers::GLFrameBufferObj>
              ((vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
                *)&this->m_SubpassFramebuffers,(GLFrameBufferObj *)&ResolveFBO.m_DrawBuffersMask,
               (GLFrameBufferObj *)local_dc);
    GLObjectWrappers::GLFrameBufferObj::~GLFrameBufferObj((GLFrameBufferObj *)local_dc);
    GLObjectWrappers::GLFrameBufferObj::~GLFrameBufferObj
              ((GLFrameBufferObj *)&ResolveFBO.m_DrawBuffersMask);
  }
  return;
}

Assistant:

FramebufferGLImpl::FramebufferGLImpl(IReferenceCounters*    pRefCounters,
                                     RenderDeviceGLImpl*    pDevice,
                                     const FramebufferDesc& Desc,
                                     GLContextState&        CtxState) :
    TFramebufferBase{pRefCounters, pDevice, Desc}
{
    const auto& RPDesc = m_Desc.pRenderPass->GetDesc();
    m_SubpassFramebuffers.reserve(RPDesc.SubpassCount);
    for (Uint32 subpass = 0; subpass < RPDesc.SubpassCount; ++subpass)
    {
        const auto& SubpassDesc = RPDesc.pSubpasses[subpass];

        TextureViewGLImpl* ppRTVs[MAX_RENDER_TARGETS] = {};
        TextureViewGLImpl* pDSV                       = nullptr;

        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const auto& RTAttachmentRef = SubpassDesc.pRenderTargetAttachments[rt];
            if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                ppRTVs[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RTAttachmentRef.AttachmentIndex]);
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr && SubpassDesc.pDepthStencilAttachment->AttachmentIndex != ATTACHMENT_UNUSED)
        {
            pDSV = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[SubpassDesc.pDepthStencilAttachment->AttachmentIndex]);
        }
        auto RenderTargetFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV) ?
            GLObjectWrappers::GLFrameBufferObj{false} :
            FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV, Desc.Width, Desc.Height);

        GLObjectWrappers::GLFrameBufferObj ResolveFBO{false};
        if (SubpassDesc.pResolveAttachments != nullptr)
        {
            TextureViewGLImpl* ppRsvlViews[MAX_RENDER_TARGETS] = {};
            for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
            {
                const auto& RslvAttachmentRef = SubpassDesc.pResolveAttachments[rt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    ppRsvlViews[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RslvAttachmentRef.AttachmentIndex]);
                }
            }
            ResolveFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr) ?
                GLObjectWrappers::GLFrameBufferObj{false} :
                FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr, Desc.Width, Desc.Height);
        }

        RenderTargetFBO.SetName(m_Desc.Name);

        m_SubpassFramebuffers.emplace_back(std::move(RenderTargetFBO), std::move(ResolveFBO));
    }
}